

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O3

Reply * __thiscall
i2p::sam::Session::SendRequestAndGetReply
          (Reply *__return_storage_ptr__,Session *this,Sock *sock,string *request,
          bool check_result_ok)

{
  pointer pcVar1;
  int iVar2;
  char *pcVar3;
  runtime_error *this_00;
  CThreadInterrupt *args_1;
  pointer pSVar4;
  long in_FS_OFFSET;
  string_view separators;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar1 = (request->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + request->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_58,"\n");
  (*sock->_vptr_Sock[0x11])
            (sock,local_58._M_dataplus._M_p,local_58._M_string_length,1000,this->m_interrupt);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->full)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->full).field_2
  ;
  (__return_storage_ptr__->full)._M_string_length = 0;
  (__return_storage_ptr__->full).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->request)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->request).field_2;
  (__return_storage_ptr__->request)._M_string_length = 0;
  (__return_storage_ptr__->request).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->keys)._M_h._M_buckets =
       &(__return_storage_ptr__->keys)._M_h._M_single_bucket;
  (__return_storage_ptr__->keys)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->keys)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->keys)._M_h._M_element_count = 0;
  (__return_storage_ptr__->keys)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->keys)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->keys)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_78,request,0,0xe);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"SESSION CREATE");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  if (iVar2 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"SESSION CREATE ...","");
  }
  else {
    pcVar1 = (request->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + request->_M_string_length);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&__return_storage_ptr__->request,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  args_1 = this->m_interrupt;
  (*sock->_vptr_Sock[0x12])(&local_58,sock,10,180000,args_1,0x10000);
  SendRequestAndGetReply();
  local_58._M_dataplus._M_p = (__return_storage_ptr__->full)._M_dataplus._M_p;
  local_58._M_string_length = (__return_storage_ptr__->full)._M_string_length;
  local_78._M_dataplus._M_p._0_1_ = 0x20;
  separators._M_str = (char *)args_1;
  separators._M_len = (size_t)&local_78;
  util::Split<Span<char_const>>(&local_90,(util *)&local_58,(Span<const_char> *)0x1,separators);
  if (local_90.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_90.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar4 = local_90.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_58._M_dataplus._M_p._0_1_ = 0x3d;
      pcVar3 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (pSVar4->m_data,pSVar4->m_data + pSVar4->m_size,&local_58);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      if (pcVar3 == pSVar4->m_data + pSVar4->m_size) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string,std::nullopt_t_const&>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&__return_storage_ptr__->keys,&local_58,&std::nullopt);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pSVar4->m_data,pcVar3);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,pcVar3 + 1,pSVar4->m_data + pSVar4->m_size);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string,std::__cxx11::string>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&__return_storage_ptr__->keys,&local_58,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != local_90.
                       super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_90.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (check_result_ok) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"RESULT","");
    Reply::Get(&local_58,__return_storage_ptr__,&local_78);
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_58,"OK");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                (&local_58,(tinyformat *)"Unexpected reply to \"%s\": \"%s\"",(char *)request,
                 &__return_storage_ptr__->full,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
      std::runtime_error::runtime_error(this_00,(string *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0087a137;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0087a137:
  __stack_chk_fail();
}

Assistant:

Session::Reply Session::SendRequestAndGetReply(const Sock& sock,
                                               const std::string& request,
                                               bool check_result_ok) const
{
    sock.SendComplete(request + "\n", MAX_WAIT_FOR_IO, *m_interrupt);

    Reply reply;

    // Don't log the full "SESSION CREATE ..." because it contains our private key.
    reply.request = request.substr(0, 14) == "SESSION CREATE" ? "SESSION CREATE ..." : request;

    // It could take a few minutes for the I2P router to reply as it is querying the I2P network
    // (when doing name lookup, for example). Notice: `RecvUntilTerminator()` is checking
    // `m_interrupt` more often, so we would not be stuck here for long if `m_interrupt` is
    // signaled.
    static constexpr auto recv_timeout = 3min;

    reply.full = sock.RecvUntilTerminator('\n', recv_timeout, *m_interrupt, MAX_MSG_SIZE);

    for (const auto& kv : Split(reply.full, ' ')) {
        const auto& pos = std::find(kv.begin(), kv.end(), '=');
        if (pos != kv.end()) {
            reply.keys.emplace(std::string{kv.begin(), pos}, std::string{pos + 1, kv.end()});
        } else {
            reply.keys.emplace(std::string{kv.begin(), kv.end()}, std::nullopt);
        }
    }

    if (check_result_ok && reply.Get("RESULT") != "OK") {
        throw std::runtime_error(
            strprintf("Unexpected reply to \"%s\": \"%s\"", request, reply.full));
    }

    return reply;
}